

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall TApp_AddingExistingShort_Test::TestBody(TApp_AddingExistingShort_Test *this)

{
  bool bVar1;
  App *this_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"-c,--count","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  this_00 = &(this->super_TApp).app;
  CLI::App::add_flag(this_00,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"--cat,-c","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    CLI::App::add_flag(this_00,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_b0);
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,6,
             "Expected: app.add_flag(\"--cat,-c\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if (local_b0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_b0.ptr_ + 8))();
    }
  }
  return;
}

Assistant:

TEST_F(TApp, AddingExistingShort) {
    app.add_flag("-c,--count");
    EXPECT_THROW(app.add_flag("--cat,-c"), CLI::OptionAlreadyAdded);
}